

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O0

void __thiscall
duckdb::RowVersionManager::CleanupAppend
          (RowVersionManager *this,transaction_t lowest_active_transaction,idx_t row_group_start,
          idx_t count)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  long in_RCX;
  ulong in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  bool cleanup;
  unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true> new_info;
  ChunkInfo *info;
  idx_t vcount;
  idx_t vector_idx;
  idx_t end_vector_idx;
  idx_t start_vector_idx;
  lock_guard<std::mutex> lock;
  idx_t row_group_end;
  mutex_type *in_stack_ffffffffffffff38;
  vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
  *in_stack_ffffffffffffff40;
  long local_88;
  undefined1 local_70 [8];
  type local_68;
  long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  long local_28;
  ulong local_18;
  undefined8 local_10;
  
  if (in_RCX != 0) {
    local_28 = in_RDX + in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    ::std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_40 = local_28 - 1U >> 0xb;
    local_48 = local_18 >> 0xb;
    local_38 = local_48;
    for (; uVar1 = local_48, local_48 <= local_40; local_48 = local_48 + 1) {
      if (local_48 == local_40) {
        local_88 = local_28 + local_40 * -0x800;
      }
      else {
        local_88 = 0x800;
      }
      local_50 = local_88;
      if ((local_88 == 0x800) &&
         (sVar4 = ::std::
                  vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                  ::size((vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                          *)(in_RDI + 0x30)), uVar1 < sVar4)) {
        vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
        ::operator[](in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
        bVar2 = ::std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_> *
                           )0xbaac05);
        if (bVar2) {
          vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
          ::operator[](in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
          local_68 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::
                     operator*((unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>
                                *)in_stack_ffffffffffffff40);
          unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::unique_ptr
                    ((unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true> *)
                     0xbaac68);
          uVar3 = (*local_68->_vptr_ChunkInfo[7])(local_68,local_10,local_70);
          if ((uVar3 & 1) != 0) {
            in_stack_ffffffffffffff40 =
                 (vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                  *)vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                    ::operator[](in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
            unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::operator=
                      ((unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>
                        *)in_stack_ffffffffffffff40,
                       (unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>
                        *)in_stack_ffffffffffffff38);
          }
          unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::~unique_ptr
                    ((unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true> *)
                     0xbaacec);
        }
      }
    }
    ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xbaad12);
  }
  return;
}

Assistant:

void RowVersionManager::CleanupAppend(transaction_t lowest_active_transaction, idx_t row_group_start, idx_t count) {
	if (count == 0) {
		return;
	}
	idx_t row_group_end = row_group_start + count;

	lock_guard<mutex> lock(version_lock);
	idx_t start_vector_idx = row_group_start / STANDARD_VECTOR_SIZE;
	idx_t end_vector_idx = (row_group_end - 1) / STANDARD_VECTOR_SIZE;
	for (idx_t vector_idx = start_vector_idx; vector_idx <= end_vector_idx; vector_idx++) {
		idx_t vcount =
		    vector_idx == end_vector_idx ? row_group_end - end_vector_idx * STANDARD_VECTOR_SIZE : STANDARD_VECTOR_SIZE;
		if (vcount != STANDARD_VECTOR_SIZE) {
			// not written fully - skip
			continue;
		}
		if (vector_idx >= vector_info.size() || !vector_info[vector_idx]) {
			// already vacuumed - skip
			continue;
		}
		auto &info = *vector_info[vector_idx];
		// if we wrote the entire chunk info try to compress it
		unique_ptr<ChunkInfo> new_info;
		auto cleanup = info.Cleanup(lowest_active_transaction, new_info);
		if (cleanup) {
			vector_info[vector_idx] = std::move(new_info);
		}
	}
}